

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mtmsrd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_ptr arg1;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    uVar1 = tb_cflags((ctx->base).tb);
    if ((uVar1 & 0x20000) != 0) {
      gen_io_start(tcg_ctx_00);
    }
    if ((ctx->opcode & 0x10000) == 0) {
      gen_update_nip(ctx,(ctx->base).pc_next);
      arg1 = tcg_ctx_00->cpu_env;
      uVar1 = rS(ctx->opcode);
      gen_helper_store_msr(tcg_ctx_00,arg1,cpu_gpr[uVar1]);
    }
    else {
      ret = tcg_temp_new_i64(tcg_ctx_00);
      ret_00 = tcg_temp_new_i64(tcg_ctx_00);
      uVar1 = rS(ctx->opcode);
      tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1],0x8002);
      tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret_00,cpu_msr,-0x8003);
      tcg_gen_or_i64_ppc64(tcg_ctx_00,ret_00,ret_00,ret);
      gen_helper_store_msr(tcg_ctx_00,tcg_ctx_00->cpu_env,ret_00);
      tcg_temp_free_i64(tcg_ctx_00,ret);
      tcg_temp_free_i64(tcg_ctx_00,ret_00);
    }
    gen_stop_exception(ctx);
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_mtmsrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;

    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    if (ctx->opcode & 0x00010000) {
        /* L=1 form only updates EE and RI */
        TCGv t0 = tcg_temp_new(tcg_ctx);
        TCGv t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)],
                        (1 << MSR_RI) | (1 << MSR_EE));
        tcg_gen_andi_tl(tcg_ctx, t1, cpu_msr,
                        ~(target_ulong)((1 << MSR_RI) | (1 << MSR_EE)));
        tcg_gen_or_tl(tcg_ctx, t1, t1, t0);

        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, t1);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);

    } else {
        /*
         * XXX: we need to update nip before the store if we enter
         *      power saving mode, we will exit the loop directly from
         *      ppc_store_msr
         */
        gen_update_nip(ctx, ctx->base.pc_next);
        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rS(ctx->opcode)]);
    }
    /* Must stop the translation as machine state (may have) changed */
    gen_stop_exception(ctx);
}